

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool llvm::sys::path::has_root_name(Twine *path,Style style)

{
  bool bVar1;
  StringRef path_00;
  StringRef local_d8 [2];
  char *pcStack_b8;
  StringRef p;
  SmallString<128U> path_storage;
  Style style_local;
  Twine *path_local;
  
  SmallString<128U>::SmallString((SmallString<128U> *)&p.Length);
  path_00 = Twine::toStringRef(path,(SmallVectorImpl<char> *)&p.Length);
  p.Data = (char *)path_00.Length;
  pcStack_b8 = path_00.Data;
  local_d8[0] = root_name(path_00,style);
  bVar1 = StringRef::empty(local_d8);
  SmallString<128U>::~SmallString((SmallString<128U> *)&p.Length);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool has_root_name(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !root_name(p, style).empty();
}